

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

char * __thiscall Qentem::String<char>::allocate(String<char> *this,SizeT new_size)

{
  char *ptr;
  char *ns;
  SizeT new_size_local;
  String<char> *this_local;
  
  ptr = Memory::Allocate<char>(new_size);
  setStorage(this,ptr);
  return ptr;
}

Assistant:

Char_T *allocate(SizeT new_size) {
        Char_T *ns = Memory::Allocate<Char_T>(new_size);

        setStorage(ns);

        return ns;
    }